

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O0

void __thiscall FPatchInfo::Init(FPatchInfo *this,FGIFont *gifont)

{
  bool bVar1;
  EColorRange EVar2;
  FTexture *pFVar3;
  char *pcVar4;
  FFont *pFVar5;
  FName local_1c;
  FGIFont *local_18;
  FGIFont *gifont_local;
  FPatchInfo *this_local;
  
  local_18 = gifont;
  gifont_local = (FGIFont *)this;
  bVar1 = FName::operator==(&gifont->color,NAME_Null);
  if (bVar1) {
    pcVar4 = FName::operator_cast_to_char_(&local_18->fontname);
    pFVar3 = FTextureManager::operator[](&TexMan,pcVar4);
    this->mPatch = pFVar3;
    EVar2 = CR_UNDEFINED;
    if (this->mPatch == (FTexture *)0x0) {
      EVar2 = CR_UNTRANSLATED;
    }
    this->mColor = EVar2;
    this->mFont = (FFont *)0x0;
  }
  else {
    pcVar4 = FName::operator_cast_to_char_(&local_18->fontname);
    pFVar5 = V_GetFont(pcVar4);
    this->mFont = pFVar5;
    FName::FName(&local_1c,&local_18->color);
    EVar2 = V_FindFontColor(&local_1c);
    this->mColor = EVar2;
    this->mPatch = (FTexture *)0x0;
  }
  if (this->mFont == (FFont *)0x0) {
    this->mFont = BigFont;
  }
  return;
}

Assistant:

void Init(FGIFont &gifont)
	{
		if (gifont.color == NAME_Null)
		{
			mPatch = TexMan[gifont.fontname];	// "entering"
			mColor = mPatch == NULL? CR_UNTRANSLATED : CR_UNDEFINED;
			mFont = NULL;
		}
		else
		{
			mFont = V_GetFont(gifont.fontname);
			mColor = V_FindFontColor(gifont.color);
			mPatch = NULL;
		}
		if (mFont == NULL)
		{
			mFont = BigFont;
		}
	}